

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiTextBuffer::appendfv(ImGuiTextBuffer *this,char *fmt,__va_list_tag *args)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  char *__dest;
  int iVar5;
  int iVar6;
  va_list args_copy;
  undefined8 local_48;
  void *pvStack_40;
  void *local_38;
  
  local_38 = args->reg_save_area;
  local_48._0_4_ = args->gp_offset;
  local_48._4_4_ = args->fp_offset;
  pvStack_40 = args->overflow_arg_area;
  iVar3 = vsnprintf((char *)0x0,0,fmt,args);
  if (iVar3 < 1) {
    return;
  }
  iVar1 = (this->Buf).Size;
  iVar5 = iVar1 + iVar3;
  iVar4 = (this->Buf).Capacity;
  if (iVar5 < iVar4) {
LAB_0013e121:
    if (iVar5 <= iVar4) {
      __dest = (this->Buf).Data;
      goto LAB_0013e1ab;
    }
    if (iVar4 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar4 / 2 + iVar4;
    }
    if (iVar6 <= iVar5) {
      iVar6 = iVar5;
    }
  }
  else {
    iVar6 = iVar4 * 2;
    if (iVar5 != iVar6 && SBORROW4(iVar5,iVar6) == iVar5 + iVar4 * -2 < 0) {
      iVar6 = iVar5;
    }
    if (iVar6 <= iVar4) goto LAB_0013e121;
  }
  GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
  __dest = (char *)(*GImAllocatorAllocFunc)((long)iVar6,GImAllocatorUserData);
  pcVar2 = (this->Buf).Data;
  if (pcVar2 != (char *)0x0) {
    memcpy(__dest,pcVar2,(long)(this->Buf).Size);
    pcVar2 = (this->Buf).Data;
    if (pcVar2 != (char *)0x0) {
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
    }
    (*GImAllocatorFreeFunc)(pcVar2,GImAllocatorUserData);
  }
  (this->Buf).Data = __dest;
  (this->Buf).Capacity = iVar6;
LAB_0013e1ab:
  (this->Buf).Size = iVar5;
  iVar4 = vsnprintf(__dest + (long)iVar1 + -1,(ulong)(iVar3 + 1U),fmt,&local_48);
  if (__dest + (long)iVar1 + -1 != (char *)0x0) {
    iVar5 = iVar3;
    if (iVar4 < (int)(iVar3 + 1U)) {
      iVar5 = iVar4;
    }
    if (iVar4 == -1) {
      iVar5 = iVar3;
    }
    (__dest + (long)iVar1 + -1)[iVar5] = '\0';
  }
  return;
}

Assistant:

void ImGuiTextBuffer::appendfv(const char* fmt, va_list args)
{
    va_list args_copy;
    va_copy(args_copy, args);

    int len = ImFormatStringV(NULL, 0, fmt, args);         // FIXME-OPT: could do a first pass write attempt, likely successful on first pass.
    if (len <= 0)
    {
        va_end(args_copy);
        return;
    }

    const int write_off = Buf.Size;
    const int needed_sz = write_off + len;
    if (write_off + len >= Buf.Capacity)
    {
        int double_capacity = Buf.Capacity * 2;
        Buf.reserve(needed_sz > double_capacity ? needed_sz : double_capacity);
    }

    Buf.resize(needed_sz);
    ImFormatStringV(&Buf[write_off - 1], (size_t)len + 1, fmt, args_copy);
    va_end(args_copy);
}